

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

size_t __thiscall
Memory::LargeHeapBlock::RescanMultiPage(LargeHeapBlock *this,Recycler *recycler,RescanFlags flags)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  undefined4 *puVar4;
  char **ppcVar5;
  char *local_a0;
  char *local_98;
  char *checkEnd;
  char *pcStack_88;
  bool hasWriteBarrier;
  char *pageStart;
  char *objectAddressEnd;
  size_t sStack_70;
  bool noOOMDuringMark;
  size_t objectSize;
  bool objectScanned;
  char *pcStack_60;
  uchar attributes;
  char *objectAddress;
  LargeObjectHeader *header;
  HeapBlockMap *heapBlockMap;
  char *pcStack_40;
  bool isLastPageCheckedForWriteWatchDirty;
  char *lastPageCheckedForWriteWatch;
  size_t sStack_30;
  uint objectIndex;
  size_t rescanCount;
  bool oldNeedOOMRescan;
  Recycler *pRStack_20;
  RescanFlags flags_local;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  rescanCount._4_4_ = flags;
  pRStack_20 = recycler;
  recycler_local = (Recycler *)this;
  sVar3 = GetPageCount(this);
  if (sVar3 == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x56c,"(this->GetPageCount() != 1)","this->GetPageCount() != 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  rescanCount._3_1_ = (this->super_HeapBlock).needOOMRescan & 1;
  (this->super_HeapBlock).needOOMRescan = false;
  sStack_30 = 0;
  lastPageCheckedForWriteWatch._4_4_ = 0;
  pcStack_40 = (char *)0x0;
  heapBlockMap._7_1_ = 0;
  header = (LargeObjectHeader *)&pRStack_20->heapBlockMap;
  do {
    while( true ) {
      do {
        do {
          do {
            if (this->allocCount <= lastPageCheckedForWriteWatch._4_4_) {
              return sStack_30;
            }
            objectAddress = (char *)GetHeaderByIndex(this,lastPageCheckedForWriteWatch._4_4_);
            lastPageCheckedForWriteWatch._4_4_ = lastPageCheckedForWriteWatch._4_4_ + 1;
          } while ((LargeObjectHeader *)objectAddress == (LargeObjectHeader *)0x0);
          pcStack_60 = (char *)LargeObjectHeader::GetAddress((LargeObjectHeader *)objectAddress);
          bVar2 = HeapBlockMap64::IsMarked((HeapBlockMap64 *)header,pcStack_60);
        } while (!bVar2);
        objectSize._7_1_ =
             LargeObjectHeader::GetAttributes((LargeObjectHeader *)objectAddress,pRStack_20->Cookie)
        ;
        if (((objectSize._7_1_ & 0x80) != 0) && ((objectSize._7_1_ & 4) != 0)) {
          (pRStack_20->collectionStats).finalizeCount =
               (pRStack_20->collectionStats).finalizeCount + 1;
          LargeObjectHeader::SetAttributes
                    ((LargeObjectHeader *)objectAddress,pRStack_20->Cookie,objectSize._7_1_ & 0xfb);
        }
      } while ((objectSize._7_1_ & 0x20) != 0);
      objectSize._6_1_ = 0;
      sStack_70 = *(size_t *)(objectAddress + 8);
      bVar2 = InPageHeapMode(this);
      if (bVar2) {
        sStack_70 = HeapInfo::RoundObjectSize(sStack_70);
      }
      if (sStack_70 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x5af,"(objectSize > 0)","objectSize > 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      if (((rescanCount._3_1_ & 1) == 0) && ((objectAddress[0x1a] & 1U) != 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x5b0,"(oldNeedOOMRescan || !header->markOnOOMRescan)",
                           "oldNeedOOMRescan || !header->markOnOOMRescan");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      if ((objectAddress[0x1a] & 1U) != 0) break;
      if ((pRStack_20->inEndMarkOnLowMemory & 1U) == 0) {
        pageStart = pcStack_60 + sStack_70;
        do {
          pcStack_88 = (char *)((ulong)pcStack_60 & 0xfffffffffffff000);
          if (pcStack_40 != pcStack_88) {
            heapBlockMap._7_1_ = 1;
            checkEnd._7_1_ = (byte)objectAddress[0x1a] >> 1 & 1;
            pcStack_40 = pcStack_88;
            bVar2 = IsPageDirty(this,pcStack_88,rescanCount._4_4_,(bool)checkEnd._7_1_);
            if (!bVar2) {
              heapBlockMap._7_1_ = 0;
            }
          }
          if ((heapBlockMap._7_1_ & 1) == 0) {
            pcStack_60 = pcStack_88 + 0x1000;
          }
          else {
            local_a0 = pcStack_88 + 0x1000;
            ppcVar5 = min<char*>(&local_a0,&pageStart);
            local_98 = *ppcVar5;
            if ((objectSize._7_1_ & 0x10) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                 ,0x641,"(!(attributes & TrackBit))","!(attributes & TrackBit)");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 0;
            }
            bVar2 = Recycler::AddMark(pRStack_20,pcStack_60,(long)local_98 - (long)pcStack_60);
            if ((!bVar2) &&
               (HeapBlock::SetNeedOOMRescan(&this->super_HeapBlock,pRStack_20),
               ((byte)objectAddress[0x1a] >> 2 & 1) == 0)) {
              objectAddress[0x1a] = objectAddress[0x1a] & 0xfeU | 1;
            }
            objectSize._6_1_ = 1;
            (pRStack_20->collectionStats).markData.rescanLargePageCount =
                 (pRStack_20->collectionStats).markData.rescanLargePageCount + 1;
            (pRStack_20->collectionStats).markData.rescanLargeByteCount =
                 (size_t)(local_98 +
                         ((pRStack_20->collectionStats).markData.rescanLargeByteCount -
                         (long)pcStack_60));
            pcStack_60 = local_98;
            sStack_30 = sStack_30 + 1;
          }
        } while (pcStack_60 < pageStart);
      }
LAB_0096487c:
      (pRStack_20->collectionStats).markData.rescanLargeObjectCount =
           (ulong)(objectSize._6_1_ & 1) +
           (pRStack_20->collectionStats).markData.rescanLargeObjectCount;
    }
    objectAddressEnd._7_1_ = 1;
    if ((objectSize._7_1_ & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x5c3,"(!(attributes & TrackBit))","!(attributes & TrackBit)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    objectAddressEnd._7_1_ = Recycler::AddMark(pRStack_20,pcStack_60,sStack_70);
    if ((bool)objectAddressEnd._7_1_) {
      if (((byte)objectAddress[0x1a] >> 2 & 1) == 0) {
        objectAddress[0x1a] = objectAddress[0x1a] & 0xfe;
      }
      objectSize._6_1_ = 1;
      goto LAB_0096487c;
    }
    HeapBlock::SetNeedOOMRescan(&this->super_HeapBlock,pRStack_20);
    if (((byte)objectAddress[0x1a] >> 2 & 1) == 0) {
      objectAddress[0x1a] = objectAddress[0x1a] & 0xfeU | 1;
    }
    if ((pRStack_20->inEndMarkOnLowMemory & 1U) != 0) {
      return sStack_30;
    }
  } while( true );
}

Assistant:

size_t
LargeHeapBlock::RescanMultiPage(Recycler * recycler)
#endif
{
    Assert(this->GetPageCount() != 1);
    DebugOnly(bool oldNeedOOMRescan = this->needOOMRescan);

    // Reset this, we'll increment this if we OOM again
    this->needOOMRescan = false;

    size_t rescanCount = 0;
    uint objectIndex = 0;
#if ENABLE_CONCURRENT_GC
    char * lastPageCheckedForWriteWatch = nullptr;
    bool isLastPageCheckedForWriteWatchDirty = false;
#endif

    const HeapBlockMap& heapBlockMap = recycler->heapBlockMap;

    while (objectIndex < allocCount)
    {
        // object is allocated during the concurrent mark or it is marked, do rescan
        LargeObjectHeader * header = this->GetHeaderByIndex(objectIndex);
        objectIndex++;

        // check if the object index is not allocated
        if (header == nullptr)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();

        // it is not marked, don't rescan
        if (!heapBlockMap.IsMarked(objectAddress))
        {
            continue;
        }

        unsigned char attributes = header->GetAttributes(recycler->Cookie);

#ifdef RECYCLER_STATS
        if (((attributes & FinalizeBit) != 0) && ((attributes & NewFinalizeBit) != 0))
        {
            // The concurrent thread saw a false reference to this object and marked it before the attribute was set.
            // As such, our finalizeCount is not correct.  Update it now.

            RECYCLER_STATS_INC(recycler, finalizeCount);
            header->SetAttributes(recycler->Cookie, (attributes & ~NewFinalizeBit));
        }
#endif

        // check whether the object is a leaf and doesn't need to be scanned
        if ((attributes & LeafBit) != 0)
        {
            continue;
        }

#ifdef RECYCLER_STATS
        bool objectScanned = false;
#endif

        size_t objectSize = header->objectSize;
#ifdef RECYCLER_PAGE_HEAP
        if (this->InPageHeapMode())
        {
            // trim off the trailing part which is not a pointer
            objectSize = HeapInfo::RoundObjectSize(objectSize);
        }
#endif

        Assert(objectSize > 0);
        Assert(oldNeedOOMRescan || !header->markOnOOMRescan);
        // Avoid writing to the page unnecessary by checking first
        if (header->markOnOOMRescan)
        {
            bool noOOMDuringMark = true;
#ifdef RECYCLER_VISITED_HOST
            if (attributes & TrackBit)
            {
                noOOMDuringMark = recycler->AddPreciselyTracedMark(reinterpret_cast<IRecyclerVisitedObject*>(objectAddress));
                if (noOOMDuringMark)
                {
                    // Object has been successfully processed, so clear NewTrackBit
                    header->SetAttributes(recycler->Cookie, (attributes & ~NewTrackBit));
                    RECYCLER_STATS_INTERLOCKED_INC(recycler, trackCount);
                }
            }
            else
#endif
            {
                Assert(!(attributes & TrackBit));
                noOOMDuringMark = recycler->AddMark(objectAddress, objectSize);
            }

            if (!noOOMDuringMark)
            {
                this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                if (!header->isObjectPageLocked)
#endif
                {
                    header->markOnOOMRescan = true;
                }

                // We need to bail out of rescan early only if the recycler is
                // trying to finish marking because of low memory. If this is
                // a regular rescan, we want to try and rescan all the objects
                // on the page. It's possible that the rescan OOMs but if the
                // object rescan does OOM, we'll set the right bit on the
                // object header. When we later rescan it in a low memory
                // situation, when the bit is set, we don't need to check for
                // write-watch etc. since we'd have already done that before
                // setting the bit in the non-low-memory rescan case.
                if (!recycler->inEndMarkOnLowMemory)
                {
                    continue;
                }

                return rescanCount;
            }
#ifdef RECYCLER_PAGE_HEAP
            if (!header->isObjectPageLocked)
#endif
            {
                header->markOnOOMRescan = false;
            }
#ifdef RECYCLER_STATS
            objectScanned = true;
#endif
        }
#if ENABLE_CONCURRENT_GC
        else if (!recycler->inEndMarkOnLowMemory)
        {
            char * objectAddressEnd = objectAddress + objectSize;
            // Walk through the object, checking if any of its pages have been written to
            // If it has, then queue up this object for marking
#ifdef RECYCLER_VISITED_HOST
            bool tracedObject = attributes & TrackBit;
            char * objectAddressStart = objectAddress;
#endif
            do
            {
                char * pageStart = (char *)(((size_t)objectAddress) & ~(size_t)(AutoSystemInfo::PageSize - 1));

                /*
                * The rescan logic for large conservatively scanned object is as follows:
                *  - We rescan the object if it was marked during concurrent mark
                *  - If it was marked, since the large object has multiple pages, we'll rescan only the parts that were changed
                *  - So for each page in the large object, check if it's been written to, and if it hasn't, skip looking at that region
                *  - If we can't get the write watch, rescan that region
                *  - However, this logic applies only if we're not rescanning because of an OOM
                *  - If we are rescanning this object because of OOM (i.e !rescanBecauseOfOOM = false), rescan the whole object
                * For large traced objects we rescan the object and if one of its pages has changed we will rescan the entire object
                *
                * We cache the result of the write watch and the page that it was checked on so that we don't call GetWriteWatch on the same
                * page twice and inadvertently reset the write watch on a page where we've already scanned an object
                */
                if (lastPageCheckedForWriteWatch != pageStart)
                {
                    lastPageCheckedForWriteWatch = pageStart;
                    isLastPageCheckedForWriteWatchDirty = true;
                    bool hasWriteBarrier = false;
#ifdef RECYCLER_WRITE_BARRIER
                    hasWriteBarrier = header->hasWriteBarrier;
#endif
                    if (!IsPageDirty(pageStart, flags, hasWriteBarrier))
                    {
                        // Fall through to the case below where we'll update objectAddress and continue
                        isLastPageCheckedForWriteWatchDirty = false;
                    }
                }

                if (!isLastPageCheckedForWriteWatchDirty)
                {
                    objectAddress = pageStart + AutoSystemInfo::PageSize;
                    continue;
                }

                // We're interested in only rescanning the parts of the object that have changed, not the whole
                // object. So just queue that up for marking
                char * checkEnd = min(pageStart + AutoSystemInfo::PageSize, objectAddressEnd);

#ifdef RECYCLER_VISITED_HOST
                if (tracedObject)
                {
                    // The object has one dirty page so we need to trace it
                    if (!recycler->AddPreciselyTracedMark(reinterpret_cast<IRecyclerVisitedObject*>(objectAddressStart)))
                    {
                        this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                        if (!header->isObjectPageLocked)
#endif
                        {
                            header->markOnOOMRescan = true;
                        }
                    }
                    else
                    {
                        // Object has been successfully processed, so clear NewTrackBit
                        header->SetAttributes(recycler->Cookie, (attributes & ~NewTrackBit));
                        RECYCLER_STATS_INTERLOCKED_INC(recycler, trackCount);
                    }

                    rescanCount = objectSize / AutoSystemInfo::PageSize +
                        (objectSize % AutoSystemInfo::PageSize != 0 ? 1 : 0);
#ifdef RECYCLER_STATS
                    objectScanned = true;
                    recycler->collectionStats.markData.rescanLargePageCount += rescanCount;
                    recycler->collectionStats.markData.rescanLargeByteCount += objectSize;
#endif
                    // We don't need to continue as we are tracing the whole object
                    break;
                }
                else
#endif
                {
                    Assert(!(attributes & TrackBit));
                    if (!recycler->AddMark(objectAddress, (checkEnd - objectAddress)))
                    {
                        this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                        if (!header->isObjectPageLocked)
#endif
                        {
                            header->markOnOOMRescan = true;
                        }
                    }

#ifdef RECYCLER_STATS
                    objectScanned = true;
                    recycler->collectionStats.markData.rescanLargePageCount++;
                    recycler->collectionStats.markData.rescanLargeByteCount += (checkEnd - objectAddress);
#endif
                }

                objectAddress = checkEnd;
                rescanCount++;
            }
            while (objectAddress < objectAddressEnd);
        }
#else
        else
        {
            Assert(recycler->inEndMarkOnLowMemory);
        }
#endif
        RECYCLER_STATS_ADD(recycler, markData.rescanLargeObjectCount, objectScanned);
    }

    return rescanCount;
}